

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execCmpm<(moira::Instr)40,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  bool bVar2;
  u32 uVar3;
  u32 data2;
  u32 data1;
  u32 ea2;
  u32 ea1;
  u32 local_20;
  u32 local_1c;
  u32 local_18;
  u32 local_14;
  
  bVar2 = readOp<(moira::Mode)3,(moira::Size)1,64ul>(this,opcode & 7,&local_14,&local_1c);
  if (bVar2) {
    bVar2 = readOp<(moira::Mode)3,(moira::Size)1,64ul>(this,opcode >> 9 & 7,&local_18,&local_20);
    if (bVar2) {
      (this->reg).sr.c = (bool)((byte)(local_20 - local_1c >> 8) & 1);
      bVar1 = (byte)(local_20 - local_1c);
      (this->reg).sr.v =
           (bool)((byte)(((byte)local_1c ^ (byte)local_20) & (bVar1 ^ (byte)local_20)) >> 7);
      (this->reg).sr.z = bVar1 == 0;
      (this->reg).sr.n = (bool)(bVar1 >> 7);
      uVar3 = (this->reg).pc;
      (this->reg).pc0 = uVar3;
      (this->queue).ird = (this->queue).irc;
      uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
      (this->queue).irc = (u16)uVar3;
    }
  }
  return;
}

Assistant:

void
Moira::execCmpm(u16 opcode)
{
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    u32 ea1, ea2, data1, data2;

    if (!readOp<M,S, AE_INC_PC>(src, ea1, data1)) return;
    if (!readOp<M,S, AE_INC_PC>(dst, ea2, data2)) return;

    cmp<S>(data1, data2);
    prefetch<POLLIPL>();
}